

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  uint uVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *pcVar3;
  pointer pbVar4;
  cmValue cVar5;
  string *psVar6;
  const_reference pvVar7;
  ostream *poVar8;
  undefined8 in_R8;
  pointer in_path;
  string_view arg;
  string_view str;
  string_view source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string fc;
  string cleanfile;
  string remove;
  string local_290;
  string local_270;
  string local_250;
  ofstream fout;
  
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&fc);
  cVar5 = cmMakefile::GetProperty(pcVar2,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (cVar5.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_250,(string *)cVar5.Value);
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fc,"CMAKE_BUILD_TYPE",(allocator<char> *)&remove);
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&fc);
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    cleanfile._M_string_length = 0;
    cleanfile.field_2._M_local_buf[0] = '\0';
    in_R8 = 0;
    cmGeneratorExpression::Evaluate
              ((string *)&fout,&local_250,(cmLocalGenerator *)this,psVar6,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&cleanfile);
    arg._M_str = (char *)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    ;
    arg._M_len = fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
    cmExpandList(arg,&cleanFiles,false);
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::~string((string *)&cleanfile);
    std::__cxx11::string::~string((string *)&fc);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar7 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::at(&((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                   LocalGenerators,0);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (psVar6->_M_dataplus)._M_p;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar6->_M_string_length;
    fc._M_dataplus._M_p = (pointer)0x27;
    fc._M_string_length = (size_type)anon_var_dwarf_10f2a15;
    cmStrCat<>(&cleanfile,(cmAlphaNum *)&fout,(cmAlphaNum *)&fc);
    std::ofstream::ofstream(&fout,cleanfile._M_dataplus._M_p,_S_out);
    uVar1 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3]);
    if ((uVar1 & 5) == 0) {
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                      "file(REMOVE_RECURSE\n");
      pbVar4 = cleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (in_path = cleanFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; in_path != pbVar4;
          in_path = in_path + 1) {
        pcVar3 = (pvVar7->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        cmsys::SystemTools::CollapseFullPath(&remove,in_path,psVar6);
        cmOutputConverter::MaybeRelativeToCurBinDir(&fc,&pcVar3->super_cmOutputConverter,&remove);
        std::__cxx11::string::~string((string *)&remove);
        poVar8 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
        str._M_str = (char *)0x0;
        str._M_len = (size_t)fc._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&remove,(cmOutputConverter *)fc._M_string_length,str,(WrapQuotes)in_R8);
        poVar8 = std::operator<<(poVar8,(string *)&remove);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&remove);
        std::__cxx11::string::~string((string *)&fc);
      }
      std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    }
    else {
      std::operator+(&fc,"Could not create ",&cleanfile);
      cmSystemTools::Error(&fc);
      std::__cxx11::string::~string((string *)&fc);
    }
    std::ofstream::~ofstream(&fout);
    if ((uVar1 & 5) == 0) {
      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x14;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_10f2849;
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_290,
                 &((pvVar7->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                  super_cmOutputConverter,&cleanfile);
      source._M_str = local_290._M_dataplus._M_p;
      source._M_len = local_290._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_270,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      fc._M_dataplus._M_p = (pointer)local_270._M_string_length;
      fc._M_string_length = (size_type)local_270._M_dataplus._M_p;
      cmStrCat<>(&remove,(cmAlphaNum *)&fout,(cmAlphaNum *)&fc);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 &remove);
      std::__cxx11::string::~string((string *)&remove);
    }
    std::__cxx11::string::~string((string *)&cleanfile);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  std::vector<std::string> cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(
                   *prop_value, this,
                   this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
                 cleanFiles);
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}